

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

int __thiscall
TPZCompElHCurl<pzshape::TPZShapeTetra>::ConnectOrder
          (TPZCompElHCurl<pzshape::TPZShapeTetra> *this,int connect)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  TPZConnect *this_00;
  int in_ESI;
  long *in_RDI;
  TPZConnect *c;
  stringstream sout;
  char *in_stack_00000210;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [380];
  int local_14;
  int local_4;
  
  local_14 = in_ESI;
  if ((-1 < in_ESI) && (iVar2 = (**(code **)(*in_RDI + 0x90))(), in_ESI < iVar2)) {
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_14);
    bVar1 = TPZConnect::Order(this_00);
    return (uint)bVar1;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = std::operator<<(local_190,
                           "virtual int TPZCompElHCurl<pzshape::TPZShapeTetra>::ConnectOrder(int) const [TSHAPE = pzshape::TPZShapeTetra]"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(local_190,"Connect index out of range connect ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
  poVar3 = std::operator<<(poVar3," nconnects ");
  iVar2 = (**(code **)(*in_RDI + 0x90))();
  std::ostream::operator<<(poVar3,iVar2);
  std::__cxx11::stringstream::str();
  poVar3 = std::operator<<((ostream *)&std::cerr,local_1d0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1d0);
  pzinternal::DebugStopImpl(in_stack_00000210,(size_t)this);
  local_4 = -1;
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return local_4;
}

Assistant:

int TPZCompElHCurl<TSHAPE>::ConnectOrder(int connect) const {
    if (connect < 0 || connect >= this->NConnects()) {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__<<std::endl;
        sout << "Connect index out of range connect " << connect << " nconnects " << NConnects();
        PZError<<sout.str()<<std::endl;
#ifdef PZ_LOG
        LOGPZ_ERROR(logger, sout.str())
#endif
        DebugStop();
        return -1;
    }
    TPZConnect &c = this-> Connect(connect);
    return c.Order();
}